

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
duckdb::InternalException::InternalException<duckdb::LogicalType>
          (InternalException *this,string *msg,LogicalType *params)

{
  LogicalType local_50;
  string local_38;
  
  LogicalType::LogicalType(&local_50,params);
  Exception::ConstructMessage<duckdb::LogicalType>(&local_38,msg,&local_50);
  InternalException(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  LogicalType::~LogicalType(&local_50);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}